

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

void ps_search_base_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  int32 iVar1;
  dict_t *pdVar2;
  dict2pid_t *pdVar3;
  
  dict_free(search->dict);
  dict2pid_free(search->d2p);
  if (dict == (dict_t *)0x0) {
    search->dict = (dict_t *)0x0;
    search->finish_wid = -1;
    search->start_wid = -1;
    search->silence_wid = -1;
    iVar1 = 0;
  }
  else {
    pdVar2 = dict_retain(dict);
    search->dict = pdVar2;
    search->start_wid = dict->startwid;
    search->finish_wid = dict->finishwid;
    search->silence_wid = dict->silwid;
    iVar1 = dict->n_word;
  }
  search->n_words = iVar1;
  if (d2p == (dict2pid_t *)0x0) {
    pdVar3 = (dict2pid_t *)0x0;
  }
  else {
    pdVar3 = dict2pid_retain(d2p);
  }
  search->d2p = pdVar3;
  return;
}

Assistant:

void
ps_search_base_reinit(ps_search_t *search, dict_t *dict,
                      dict2pid_t *d2p)
{
    dict_free(search->dict);
    dict2pid_free(search->d2p);
    /* FIXME: _retain() should just return NULL if passed NULL. */
    if (dict) {
        search->dict = dict_retain(dict);
        search->start_wid = dict_startwid(dict);
        search->finish_wid = dict_finishwid(dict);
        search->silence_wid = dict_silwid(dict);
        search->n_words = dict_size(dict);
    }
    else {
        search->dict = NULL;
        search->start_wid = search->finish_wid = search->silence_wid = -1;
        search->n_words = 0;
    }
    if (d2p)
        search->d2p = dict2pid_retain(d2p);
    else
        search->d2p = NULL;
}